

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

void Qentem::Memory::
     Sort<false,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
               (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *arr,uint start,uint end)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *item2;
  
  if (start != end) {
    do {
      uVar4 = start;
      if (start + 1 < end) {
        uVar5 = (ulong)(start + 1);
        uVar7 = (ulong)start;
        item2 = arr + start;
        do {
          uVar4 = (item2->Key).length_;
          uVar3 = arr[uVar5].Key.length_;
          if (uVar3 < uVar4) {
            uVar4 = uVar3;
          }
          if (uVar4 != 0) {
            uVar6 = 0;
            do {
              cVar1 = (item2->Key).storage_[uVar6];
              cVar2 = arr[uVar5].Key.storage_[uVar6];
              if (cVar2 < cVar1) break;
              if (cVar1 < cVar2) {
                uVar7 = (ulong)((int)uVar7 + 1);
                Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>
                          (arr + uVar7,arr + uVar5);
                break;
              }
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
          }
          uVar4 = (uint)uVar7;
          uVar5 = uVar5 + 1;
        } while ((uint)uVar5 != end);
        if (uVar4 != start) {
          Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(arr + uVar7,item2);
        }
      }
      Sort<false,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
                (arr,start,uVar4);
      start = uVar4 + 1;
    } while (start != end);
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}